

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolact.cpp
# Opt level: O2

void qsort_descent_inplace(vector<Object,_std::allocator<Object>_> *objects,int left,int right)

{
  float fVar1;
  pointer pOVar2;
  pointer pOVar3;
  Object *pOVar4;
  long lVar5;
  long lVar6;
  int right_00;
  int iVar7;
  int iVar8;
  int iVar9;
  Object *__b;
  pointer __a;
  int iVar10;
  int iVar11;
  
  do {
    fVar1 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
            super__Vector_impl_data._M_start[(left + right) / 2].prob;
    iVar9 = left;
    right_00 = right;
    while( true ) {
      if (right_00 < iVar9) break;
      pOVar2 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)iVar9 + -1;
      __a = pOVar2 + (long)iVar9 + -1;
      do {
        iVar10 = iVar9;
        pOVar3 = __a + 1;
        lVar5 = lVar5 + 1;
        iVar11 = iVar10 + 1;
        __a = __a + 1;
        iVar9 = iVar11;
      } while (fVar1 < pOVar3->prob);
      lVar6 = (long)right_00 + 1;
      __b = pOVar2 + (long)right_00 + 1;
      do {
        iVar7 = right_00;
        lVar6 = lVar6 + -1;
        iVar8 = iVar7 + -1;
        pOVar4 = __b + -1;
        __b = __b + -1;
        right_00 = iVar8;
      } while (pOVar4->prob <= fVar1 && fVar1 != pOVar4->prob);
      iVar9 = iVar10;
      right_00 = iVar7;
      if (lVar5 <= lVar6) {
        std::swap<Object>(__a,__b);
        iVar9 = iVar11;
        right_00 = iVar8;
      }
    }
    if (left < right_00) {
      qsort_descent_inplace(objects,left,right_00);
    }
    left = iVar9;
  } while (iVar9 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<Object>& objects, int left, int right)
{
    int i = left;
    int j = right;
    float p = objects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (objects[i].prob > p)
            i++;

        while (objects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(objects[i], objects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(objects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(objects, i, right);
        }
    }
}